

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt_test.cpp
# Opt level: O1

void __thiscall NTT_MultipliesSimple_Test::TestBody(NTT_MultipliesSimple_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  undefined1 auStack_a8 [8];
  vector<long_long,_std::allocator<long_long>_> p2;
  undefined1 local_78 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  vector<long_long,_std::allocator<long_long>_> want;
  vector<long_long,_std::allocator<long_long>_> res;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  initNTT();
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1;
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x6;
  auStack_a8 = (undefined1  [8])0x8;
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x2;
  __l._M_len = 5;
  __l._M_array = (iterator)auStack_a8;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_78,__l,
             (allocator_type *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3;
  res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4;
  res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x2;
  __l_00._M_len = 3;
  __l_00._M_array =
       (iterator)
       &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)auStack_a8,__l_00,
             (allocator_type *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  multiplyPolynomialsNTT
            ((vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)local_78,
             (vector<long_long,_std::allocator<long_long>_> *)auStack_a8);
  multiplyNaiveNTT((vector<long_long,_std::allocator<long_long>_> *)
                   &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<long_long,_std::allocator<long_long>_> *)local_78,
                   (vector<long_long,_std::allocator<long_long>_> *)auStack_a8);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"res","want",
             (vector<long_long,_std::allocator<long_long>_> *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)
             &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((char)res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/ntt_test.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage != (pointer)0x0) {
    operator_delete(want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8);
  }
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  return;
}

Assistant:

TEST(NTT, MultipliesSimple) {
    initNTT();
    vector<ll> p1 = {8, 2, 1, 6, 3};
    vector<ll> p2 = {3, 4, 2};
    vector<ll> res = multiplyPolynomialsNTT(p1, p2);
    vector<ll> want = multiplyNaiveNTT(p1, p2);
    EXPECT_EQ(res, want);
    //(vector<ll> {24, 38, 27, 26, 35, 24, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0})
}